

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Agent.cc
# Opt level: O3

void __thiscall
hrvo::Agent::Agent(Agent *this,Simulator *simulator,Vector2 *position,size_t goalNo,
                  float neighborDist,size_t maxNeighbors,float radius,Vector2 *velocity,
                  float maxAccel,float goalRadius,float prefSpeed,float maxSpeed,float orientation,
                  float uncertaintyOffset)

{
  _Rb_tree_header *p_Var1;
  
  this->simulator_ = simulator;
  this->newVelocity_ = *velocity;
  this->position_ = *position;
  Vector2::Vector2(&this->prefVelocity_);
  this->velocity_ = *velocity;
  this->goalNo_ = goalNo;
  this->maxNeighbors_ = maxNeighbors;
  this->goalRadius_ = goalRadius;
  this->maxAccel_ = maxAccel;
  this->maxSpeed_ = maxSpeed;
  this->neighborDist_ = neighborDist;
  this->orientation_ = orientation;
  this->prefSpeed_ = prefSpeed;
  this->radius_ = radius;
  this->uncertaintyOffset_ = uncertaintyOffset;
  this->reachedGoal_ = false;
  p_Var1 = &(this->candidates_)._M_t._M_impl.super__Rb_tree_header;
  (this->candidates_)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->candidates_)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->candidates_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->candidates_)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->candidates_)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  p_Var1 = &(this->neighbors_)._M_t._M_impl.super__Rb_tree_header;
  (this->neighbors_)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->neighbors_)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->neighbors_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->neighbors_)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->velocityObstacles_).
  super__Vector_base<hrvo::Agent::VelocityObstacle,_std::allocator<hrvo::Agent::VelocityObstacle>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->velocityObstacles_).
  super__Vector_base<hrvo::Agent::VelocityObstacle,_std::allocator<hrvo::Agent::VelocityObstacle>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->neighbors_)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  (this->velocityObstacles_).
  super__Vector_base<hrvo::Agent::VelocityObstacle,_std::allocator<hrvo::Agent::VelocityObstacle>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  return;
}

Assistant:

Agent::Agent(Simulator *simulator, const Vector2 &position, std::size_t goalNo,
             float neighborDist, std::size_t maxNeighbors, float radius,
             const Vector2 &velocity, float maxAccel, float goalRadius,
             float prefSpeed, float maxSpeed, float orientation,
#if HRVO_DIFFERENTIAL_DRIVE
             float timeToOrientation, float wheelTrack,
#endif /* HRVO_DIFFERENTIAL_DRIVE */
             float uncertaintyOffset)
    : simulator_(simulator),
      newVelocity_(velocity),
      position_(position),
      velocity_(velocity),
      goalNo_(goalNo),
      maxNeighbors_(maxNeighbors),
      goalRadius_(goalRadius),
      maxAccel_(maxAccel),
      maxSpeed_(maxSpeed),
      neighborDist_(neighborDist),
      orientation_(orientation),
      prefSpeed_(prefSpeed),
      radius_(radius),
      uncertaintyOffset_(uncertaintyOffset),
#if HRVO_DIFFERENTIAL_DRIVE
      leftWheelSpeed_(0.0F),
      rightWheelSpeed_(0.0F),
      timeToOrientation_(timeToOrientation),
      wheelTrack_(wheelTrack),
#endif /* HRVO_DIFFERENTIAL_DRIVE */
      reachedGoal_(false) {
#if HRVO_DIFFERENTIAL_DRIVE
  computeWheelSpeeds();
#endif /* HRVO_DIFFERENTIAL_DRIVE */
}